

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O2

void * mi_heap_alloc_new(mi_heap_t *heap,size_t size)

{
  void *pvVar1;
  
  pvVar1 = mi_heap_malloc(heap,size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  pvVar1 = mi_heap_try_new(heap,size,false);
  return pvVar1;
}

Assistant:

void* mi_heap_alloc_new(mi_heap_t* heap, size_t size) {
  void* p = mi_heap_malloc(heap,size);
  if mi_unlikely(p == NULL) return mi_heap_try_new(heap, size, false);
  return p;
}